

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O0

void CPP::WriteInitialization::addInitializer
               (Item *item,QString *name,int column,QString *value,QString *directive,
               bool translatable)

{
  byte bVar1;
  bool bVar2;
  QChar QVar3;
  QTextStream *pQVar4;
  QString *in_RCX;
  int in_EDX;
  Item *in_R8;
  byte in_R9B;
  long in_FS_OFFSET;
  QStringView QVar5;
  QTextStream str;
  QString setter;
  undefined8 in_stack_ffffffffffffff68;
  OpenModeFlag flags;
  QFlags<QIODeviceBase::OpenModeFlag> *in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff78 [16];
  unkbyte9 Var6;
  undefined4 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8e;
  uint local_34;
  undefined8 local_30;
  undefined8 local_28;
  QString local_20;
  long local_8;
  
  flags = (OpenModeFlag)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_R9B & 1;
  bVar2 = QString::isEmpty((QString *)0x13f3b7);
  if (!bVar2) {
    local_20.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_20.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_20.d.size = -0x5555555555555556;
    QString::QString((QString *)0x13f3f3);
    local_30 = 0xaaaaaaaaaaaaaaaa;
    local_28 = 0xaaaaaaaaaaaaaaaa;
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags(in_stack_ffffffffffffff70,flags);
    QTextStream::QTextStream((QTextStream *)&local_30,&local_20,(QFlags_conflict *)(ulong)local_34);
    pQVar4 = (QTextStream *)
             QTextStream::operator<<((QTextStream *)&local_30,(QString *)language::derefPointer);
    pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,"set");
    QString::at(in_stack_ffffffffffffff78._0_8_,(qsizetype)in_stack_ffffffffffffff70);
    QVar3 = QChar::toUpper((QChar *)in_stack_ffffffffffffff70);
    pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,QVar3);
    QStringView::QStringView<QString,_true>
              (in_stack_ffffffffffffff78._8_8_,in_stack_ffffffffffffff78._0_8_);
    QVar5 = QStringView::mid((QStringView *)
                             CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff8e,
                                                     CONCAT24(QVar3.ucs,in_stack_ffffffffffffff88)))
                             ,(qsizetype)in_RCX,(qsizetype)in_R8);
    pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,(QStringView *)QVar5.m_size);
    Var6 = QVar5._7_9_;
    QTextStream::operator<<(pQVar4,'(');
    if (-1 < in_EDX) {
      pQVar4 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_30,in_EDX);
      QTextStream::operator<<(pQVar4,", ");
    }
    pQVar4 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_30,in_RCX);
    QTextStream::operator<<(pQVar4,");");
    Item::addSetter(in_R8,(QString *)
                          CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff8e,
                                                  CONCAT24(QVar3.ucs,in_stack_ffffffffffffff88))),
                    (QString *)((unkuint9)Var6 >> 8),SUB91(Var6,0));
    QTextStream::~QTextStream((QTextStream *)&local_30);
    QString::~QString((QString *)0x13f549);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteInitialization::addInitializer(Item *item, const QString &name,
                                         int column, const QString &value,
                                         const QString &directive, bool translatable)
{
    if (!value.isEmpty()) {
        QString setter;
        QTextStream str(&setter);
        str << language::derefPointer << "set" << name.at(0).toUpper() << QStringView{name}.mid(1) << '(';
        if (column >= 0)
            str << column << ", ";
        str << value << ");";
        item->addSetter(setter, directive, translatable);
    }
}